

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void in_memory_snapshot_compaction_test(void)

{
  void *pvVar1;
  fdb_kvs_handle *pfVar2;
  fdb_status fVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  uint uVar7;
  fdb_doc *doc_00;
  char keystr [6];
  fdb_file_handle *db_file;
  fdb_kvs_handle *snap;
  fdb_doc *doc;
  fdb_iterator *fit;
  char valuestr [10];
  fdb_kvs_handle *db;
  fdb_kvs_handle *db2;
  size_t valuelen;
  void *value_out;
  cb_inmem_snap_args cargs;
  fdb_kvs_config local_390;
  fdb_kvs_info info;
  timeval __test_begin;
  char key [256];
  fdb_config local_230;
  char cmd [256];
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  builtin_strncpy(keystr,"k%05d",6);
  builtin_strncpy(valuestr,"value%08d",10);
  builtin_strncpy(cmd,"rm -rf  mvcc_test* > errorlog.txt",0x22);
  system(cmd);
  memleak_start();
  pcVar5 = (char *)malloc(0x20);
  fdb_get_default_config();
  local_230.seqtree_opt = '\x01';
  local_230.durability_opt = '\x02';
  local_230.wal_flush_before_commit = true;
  local_230.wal_threshold = 2;
  local_230.multi_kv_instances = true;
  local_230.buffercache_size = 0;
  local_230.compaction_cb = cb_inmem_snap;
  local_230.compaction_cb_mask = 2;
  local_230.compaction_cb_ctx = &cargs;
  fdb_get_default_kvs_config();
  fVar3 = fdb_open(&db_file,"./mvcc_test",&local_230);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x662);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x662,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_kvs_open(db_file,&db,"db",&local_390);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x664);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x664,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_kvs_open(db_file,&db2,"db",&local_390);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x667);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x667,"void in_memory_snapshot_compaction_test()");
  }
  cargs.handle = db2;
  cargs.n = 10;
  cargs.move_count = 0;
  cargs.keystr = keystr;
  cargs.valuestr = valuestr;
  cargs.value_len = 0x20;
  uVar7 = 0;
  while (uVar7 != 10) {
    sprintf(key,keystr,(ulong)uVar7);
    builtin_strncpy(pcVar5,"xxxxxxxxxxxxxxxxxxxxxxxxxx<end>",0x20);
    sprintf(pcVar5,valuestr,(ulong)uVar7);
    pfVar2 = db;
    sVar6 = strlen(key);
    fVar3 = fdb_set_kv(pfVar2,key,sVar6 + 1,pcVar5,0x20);
    uVar7 = uVar7 + 1;
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x678);
      in_memory_snapshot_compaction_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x678,"void in_memory_snapshot_compaction_test()");
    }
  }
  fVar3 = fdb_commit(db_file,'\x01');
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x67b);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x67b,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_compact(db_file,"./mvcc_test2");
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x67e);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x67e,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_snapshot_open(db,&snap,0xffffffffffffffff);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x682);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x682,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_get_kvs_info(snap,&info);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x685);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x685,"void in_memory_snapshot_compaction_test()");
  }
  if (info.last_seqnum != 0xb) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
           );
    in_memory_snapshot_compaction_test()::__test_pass = '\x01';
    if (info.last_seqnum != 0xb) {
      __assert_fail("info.last_seqnum == (fdb_seqnum_t)n+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x686,"void in_memory_snapshot_compaction_test()");
    }
  }
  fVar3 = fdb_iterator_init(snap,&fit,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x689);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x689,"void in_memory_snapshot_compaction_test()");
  }
  uVar7 = 0;
  do {
    doc = (fdb_doc *)0x0;
    fVar3 = fdb_iterator_get(fit,&doc);
    doc_00 = doc;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    if (uVar7 < 10) {
      sprintf(key,keystr,(ulong)uVar7);
      builtin_strncpy(pcVar5,"xxxxxxxxxxxxxxxxxxxxxxxxxx<end>",0x20);
      sprintf(pcVar5,valuestr,(ulong)uVar7);
      doc_00 = doc;
      pvVar1 = doc->key;
      iVar4 = bcmp(pvVar1,key,doc->keylen);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x698);
        in_memory_snapshot_compaction_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x698,"void in_memory_snapshot_compaction_test()");
      }
      pvVar1 = doc_00->body;
      iVar4 = bcmp(pvVar1,pcVar5,doc_00->bodylen);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar5,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x699);
        in_memory_snapshot_compaction_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x699,"void in_memory_snapshot_compaction_test()");
      }
    }
    else {
      builtin_strncpy(key,"new_key",8);
      builtin_strncpy(pcVar5,"new_value",10);
      pvVar1 = doc->key;
      iVar4 = bcmp(pvVar1,key,doc->keylen);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",key,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x69e);
        in_memory_snapshot_compaction_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x69e,"void in_memory_snapshot_compaction_test()");
      }
      pvVar1 = doc_00->body;
      iVar4 = bcmp(pvVar1,pcVar5,doc_00->bodylen);
      if (iVar4 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar5,pvVar1,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x69f);
        in_memory_snapshot_compaction_test()::__test_pass = 1;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x69f,"void in_memory_snapshot_compaction_test()");
      }
    }
    uVar7 = uVar7 + 1;
    fdb_doc_free(doc_00);
    fVar3 = fdb_iterator_next(fit);
  } while (fVar3 == FDB_RESULT_SUCCESS);
  if (uVar7 != 0xb) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6a5);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("c == n + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x6a5,"void in_memory_snapshot_compaction_test()");
  }
  fVar3 = fdb_iterator_close(fit);
  pfVar2 = snap;
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6a8);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x6a8,"void in_memory_snapshot_compaction_test()");
  }
  sVar6 = strlen(key);
  fVar3 = fdb_get_kv(pfVar2,key,sVar6 + 1,&value_out,&valuelen);
  if (fVar3 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6ab);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x6ab,"void in_memory_snapshot_compaction_test()");
  }
  iVar4 = bcmp(value_out,pcVar5,valuelen);
  if (iVar4 == 0) {
    fdb_free_block(value_out);
    fdb_kvs_close(snap);
    fVar3 = fdb_close(db_file);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x6b2);
      in_memory_snapshot_compaction_test()::__test_pass = 1;
      __assert_fail("s == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x6b2,"void in_memory_snapshot_compaction_test()");
    }
    fVar3 = fdb_shutdown();
    if (fVar3 == FDB_RESULT_SUCCESS) {
      free(pcVar5);
      memleak_end();
      pcVar5 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar5 = "%s FAILED\n";
      }
      fprintf(_stderr,pcVar5,"in-memory snapshot with concurrent compaction test");
      return;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x6b4);
    in_memory_snapshot_compaction_test()::__test_pass = 1;
    __assert_fail("s == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x6b4,"void in_memory_snapshot_compaction_test()");
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar5,value_out,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x6ac);
  in_memory_snapshot_compaction_test()::__test_pass = 1;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x6ac,"void in_memory_snapshot_compaction_test()");
}

Assistant:

void in_memory_snapshot_compaction_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, c, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "k%05d";
    char valuestr[] = "value%08d";
    void *value_out;
    size_t valuelen;
    fdb_file_handle *db_file;
    fdb_kvs_handle *db, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    struct cb_inmem_snap_args cargs;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    config = fdb_get_default_config();
    config.durability_opt = FDB_DRB_ASYNC;
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.wal_threshold = n/5;
    config.multi_kv_instances = true;
    config.buffercache_size = 0;
    config.compaction_cb = cb_inmem_snap;
    config.compaction_cb_mask = FDB_CS_MOVE_DOC;
    config.compaction_cb_ctx = &cargs;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(db_file, &db2, "db", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    cargs.handle = db2;
    cargs.move_count = 0;
    cargs.n = n;
    cargs.keystr = keystr;
    cargs.valuestr = valuestr;
    cargs.value_len = value_len;

    // write
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(db_file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_compact(db_file, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open in-memory snapshot
    s = fdb_snapshot_open(db, &snap, FDB_SNAPSHOT_INMEM);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(snap, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(info.last_seqnum == (fdb_seqnum_t)n+1);

    s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    c = 0;
    do {
        doc = NULL;
        s = fdb_iterator_get(fit, &doc);
        if (s != FDB_RESULT_SUCCESS) {
            break;
        }
        if (c < n) {
            idx = c;
            sprintf(key, keystr, idx);
            memset(value, 'x', value_len);
            memcpy(value + value_len - 6, "<end>", 6);
            sprintf(value, valuestr, idx);
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        } else {
            // new document
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            TEST_CMP(doc->key, key, doc->keylen);
            TEST_CMP(doc->body, value, doc->bodylen);
        }

        c++;
        fdb_doc_free(doc);
    } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
    TEST_CHK(c == n + 1);

    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CMP(value_out, value, valuelen);
    fdb_free_block(value_out);

    fdb_kvs_close(snap);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);

    memleak_end();

    TEST_RESULT("in-memory snapshot with concurrent compaction test");
}